

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall
Connection_connectionIdFromReverseVariablesToThoseSet_Test::
~Connection_connectionIdFromReverseVariablesToThoseSet_Test
          (Connection_connectionIdFromReverseVariablesToThoseSet_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Connection, connectionIdFromReverseVariablesToThoseSet)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();
    libcellml::ComponentPtr comp2 = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    comp1->setName("component1");
    comp2->setName("component2");
    v1->setName("variable1");
    v2->setName("variable2");

    comp1->addVariable(v1);
    comp2->addVariable(v2);
    m->addComponent(comp1);
    m->addComponent(comp2);
    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::setEquivalenceConnectionId(v1, v2, "connection_id");

    EXPECT_EQ("connection_id", libcellml::Variable::equivalenceConnectionId(v2, v1));
}